

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O1

Dec_Graph_t * Abc_ManResubQuit1(Abc_Obj_t *pRoot,Abc_Obj_t *pObj0,Abc_Obj_t *pObj1,int fOrGate)

{
  Dec_Graph_t *pDVar1;
  Dec_Node_t *pDVar2;
  uint uVar3;
  Dec_Edge_t DVar4;
  void *pvVar5;
  void *pvVar6;
  Dec_Edge_t eEdge;
  uint uVar7;
  
  pvVar5 = (void *)((ulong)pObj0 & 0xfffffffffffffffe);
  pvVar6 = (void *)((ulong)pObj1 & 0xfffffffffffffffe);
  if (pvVar5 != pvVar6) {
    pDVar1 = (Dec_Graph_t *)malloc(0x20);
    pDVar1->fConst = 0;
    pDVar1->nLeaves = 0;
    pDVar1->nSize = 0;
    pDVar1->nCap = 0;
    pDVar1->pNodes = (Dec_Node_t *)0x0;
    *(undefined8 *)&pDVar1->eRoot = 0;
    pDVar1->nLeaves = 2;
    pDVar1->nSize = 2;
    pDVar1->nCap = 0x36;
    pDVar2 = (Dec_Node_t *)malloc(0x510);
    pDVar1->pNodes = pDVar2;
    pDVar2->eEdge0 = (Dec_Edge_t)0x0;
    pDVar2->eEdge1 = (Dec_Edge_t)0x0;
    (pDVar2->field_2).pFunc = (void *)0x0;
    pDVar2[1].field_2.pFunc = (void *)0x0;
    *(undefined8 *)&pDVar2[1].field_0x10 = 0;
    *(undefined8 *)&pDVar2->field_0x10 = 0;
    pDVar2[1].eEdge0 = (Dec_Edge_t)0x0;
    pDVar2[1].eEdge1 = (Dec_Edge_t)0x0;
    (pDVar2->field_2).pFunc = pvVar5;
    pDVar2[1].field_2.pFunc = pvVar6;
    DVar4 = (Dec_Edge_t)(((uint)pObj0 ^ *(uint *)((long)pvVar5 + 0x14) >> 7) & 1);
    uVar7 = ((uint)pObj1 ^ *(uint *)((long)pvVar6 + 0x14) >> 7) & 1;
    uVar3 = uVar7 << 0x10 | (int)DVar4 << 0xf;
    pDVar2 = pDVar1->pNodes;
    pDVar1->nSize = 3;
    pDVar2[2].eEdge0 = (Dec_Edge_t)0x0;
    pDVar2[2].eEdge1 = (Dec_Edge_t)0x0;
    pDVar2[2].field_2.pFunc = (void *)0x0;
    *(undefined8 *)&pDVar2[2].field_0x10 = 0;
    pDVar2[2].eEdge0 = DVar4;
    pDVar2[2].eEdge1 = (Dec_Edge_t)(uVar7 + 2);
    if (fOrGate == 0) {
      *(uint *)&pDVar2[2].field_0x10 = uVar3;
      DVar4 = (Dec_Edge_t)0x4;
    }
    else {
      *(uint *)&pDVar2[2].field_0x10 = uVar3 | 0x4000;
      pDVar2[2].eEdge0 = (Dec_Edge_t)((uint)DVar4 ^ 1);
      pDVar2[2].eEdge1 = (Dec_Edge_t)(uVar7 ^ 3);
      DVar4 = (Dec_Edge_t)0x5;
    }
    pDVar1->eRoot = DVar4;
    if ((pRoot->field_0x14 & 0x80) != 0) {
      pDVar1->eRoot = (Dec_Edge_t)((uint)DVar4 ^ 1);
    }
    return pDVar1;
  }
  __assert_fail("Abc_ObjRegular(pObj0) != Abc_ObjRegular(pObj1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                ,0x28d,"Dec_Graph_t *Abc_ManResubQuit1(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, int)")
  ;
}

Assistant:

Dec_Graph_t * Abc_ManResubQuit1( Abc_Obj_t * pRoot, Abc_Obj_t * pObj0, Abc_Obj_t * pObj1, int fOrGate )
{
    Dec_Graph_t * pGraph;
    Dec_Edge_t eRoot, eNode0, eNode1;
    assert( Abc_ObjRegular(pObj0) != Abc_ObjRegular(pObj1) );
    pGraph = Dec_GraphCreate( 2 );
    Dec_GraphNode( pGraph, 0 )->pFunc = Abc_ObjRegular(pObj0);
    Dec_GraphNode( pGraph, 1 )->pFunc = Abc_ObjRegular(pObj1);
    eNode0 = Dec_EdgeCreate( 0, Abc_ObjRegular(pObj0)->fPhase ^ Abc_ObjIsComplement(pObj0) );
    eNode1 = Dec_EdgeCreate( 1, Abc_ObjRegular(pObj1)->fPhase ^ Abc_ObjIsComplement(pObj1) );
    if ( fOrGate ) 
        eRoot  = Dec_GraphAddNodeOr( pGraph, eNode0, eNode1 );
    else
        eRoot  = Dec_GraphAddNodeAnd( pGraph, eNode0, eNode1 );
    Dec_GraphSetRoot( pGraph, eRoot );
    if ( pRoot->fPhase )
        Dec_GraphComplement( pGraph );
    return pGraph;
}